

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# id_test.c
# Opt level: O0

void test_dynamic(void)

{
  nng_err nVar1;
  int iVar2;
  nng_err num;
  char *pcVar3;
  char *pcVar4;
  nng_err result__6;
  nng_err result__5;
  nng_err result__4;
  nng_err result__3;
  nng_err result__2;
  nng_err result__1;
  nng_err result_;
  uint64_t id;
  int expect [5];
  nni_id_map m;
  
  nni_id_map_init((nni_id_map *)(expect + 4),10,0xd,false);
  nVar1 = nni_id_alloc((nni_id_map *)(expect + 4),(uint64_t *)&result__1,&id);
  pcVar3 = nng_strerror(nVar1);
  iVar2 = acutest_check_((uint)(nVar1 == NNG_OK),
                         "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/core/id_test.c"
                         ,0x91,"%s: expected success, got %s (%d)",
                         "nni_id_alloc(&m, &id, &expect[0])",pcVar3,nVar1);
  if (iVar2 == 0) {
    acutest_abort_();
  }
  acutest_check_((uint)(_result__1 == 10),
                 "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/core/id_test.c"
                 ,0x92,"%s","id == 10");
  nVar1 = nni_id_alloc((nni_id_map *)(expect + 4),(uint64_t *)&result__1,(void *)((long)&id + 4));
  pcVar3 = nng_strerror(nVar1);
  iVar2 = acutest_check_((uint)(nVar1 == NNG_OK),
                         "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/core/id_test.c"
                         ,0x93,"%s: expected success, got %s (%d)",
                         "nni_id_alloc(&m, &id, &expect[1])",pcVar3,nVar1);
  if (iVar2 == 0) {
    acutest_abort_();
  }
  acutest_check_((uint)(_result__1 == 0xb),
                 "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/core/id_test.c"
                 ,0x94,"%s","id == 11");
  nVar1 = nni_id_alloc((nni_id_map *)(expect + 4),(uint64_t *)&result__1,expect);
  pcVar3 = nng_strerror(nVar1);
  iVar2 = acutest_check_((uint)(nVar1 == NNG_OK),
                         "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/core/id_test.c"
                         ,0x95,"%s: expected success, got %s (%d)",
                         "nni_id_alloc(&m, &id, &expect[2])",pcVar3,nVar1);
  if (iVar2 == 0) {
    acutest_abort_();
  }
  acutest_check_((uint)(_result__1 == 0xc),
                 "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/core/id_test.c"
                 ,0x96,"%s","id == 12");
  nVar1 = nni_id_alloc((nni_id_map *)(expect + 4),(uint64_t *)&result__1,expect + 1);
  pcVar3 = nng_strerror(nVar1);
  iVar2 = acutest_check_((uint)(nVar1 == NNG_OK),
                         "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/core/id_test.c"
                         ,0x97,"%s: expected success, got %s (%d)",
                         "nni_id_alloc(&m, &id, &expect[3])",pcVar3,nVar1);
  if (iVar2 == 0) {
    acutest_abort_();
  }
  acutest_check_((uint)(_result__1 == 0xd),
                 "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/core/id_test.c"
                 ,0x98,"%s","id == 13");
  num = nni_id_alloc((nni_id_map *)(expect + 4),(uint64_t *)&result__1,expect + 2);
  pcVar3 = nng_strerror(NNG_ENOMEM);
  acutest_check_((uint)(num == NNG_ENOMEM),
                 "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/core/id_test.c"
                 ,0x9b,"%s fails with %s","nni_id_alloc(&m, &id, &expect[4])",pcVar3,nVar1);
  pcVar3 = nng_strerror(NNG_ENOMEM);
  pcVar4 = nng_strerror(num);
  acutest_message_("%s: expected %s (%d), got %s (%d)","nni_id_alloc(&m, &id, &expect[4])",pcVar3,2,
                   pcVar4,(ulong)num);
  nVar1 = nni_id_remove((nni_id_map *)(expect + 4),0xb);
  pcVar3 = nng_strerror(nVar1);
  iVar2 = acutest_check_((uint)(nVar1 == NNG_OK),
                         "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/core/id_test.c"
                         ,0x9e,"%s: expected success, got %s (%d)","nni_id_remove(&m, 11)",pcVar3,
                         nVar1);
  if (iVar2 == 0) {
    acutest_abort_();
  }
  nVar1 = nni_id_alloc((nni_id_map *)(expect + 4),(uint64_t *)&result__1,expect + 2);
  pcVar3 = nng_strerror(nVar1);
  iVar2 = acutest_check_((uint)(nVar1 == NNG_OK),
                         "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/core/id_test.c"
                         ,0xa1,"%s: expected success, got %s (%d)",
                         "nni_id_alloc(&m, &id, &expect[4])",pcVar3,nVar1);
  if (iVar2 == 0) {
    acutest_abort_();
  }
  acutest_check_((uint)(_result__1 == 0xb),
                 "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/core/id_test.c"
                 ,0xa2,"%s","id == 11");
  nni_id_map_fini((nni_id_map *)(expect + 4));
  return;
}

Assistant:

void
test_dynamic(void)
{
	nni_id_map m;
	int        expect[5];
	uint64_t   id;

	nni_id_map_init(&m, 10, 13, false);

	// We can fill the table.
	NUTS_PASS(nni_id_alloc(&m, &id, &expect[0]));
	NUTS_TRUE(id == 10);
	NUTS_PASS(nni_id_alloc(&m, &id, &expect[1]));
	NUTS_TRUE(id == 11);
	NUTS_PASS(nni_id_alloc(&m, &id, &expect[2]));
	NUTS_TRUE(id == 12);
	NUTS_PASS(nni_id_alloc(&m, &id, &expect[3]));
	NUTS_TRUE(id == 13);

	// Adding another fails.
	NUTS_FAIL(nni_id_alloc(&m, &id, &expect[4]), NNG_ENOMEM);

	// Delete one.
	NUTS_PASS(nni_id_remove(&m, 11));

	// And now we can allocate one.
	NUTS_PASS(nni_id_alloc(&m, &id, &expect[4]));
	NUTS_TRUE(id == 11);
	nni_id_map_fini(&m);
}